

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuklib_integer.h
# Opt level: O0

uint64_t read64ne(uint8_t *buf)

{
  uint64_t num;
  uint8_t *buf_local;
  
  return *(uint64_t *)buf;
}

Assistant:

static inline uint64_t
read64ne(const uint8_t *buf)
{
#if defined(TUKLIB_FAST_UNALIGNED_ACCESS) \
		&& defined(TUKLIB_USE_UNSAFE_TYPE_PUNNING)
	return *(const uint64_t *)buf;
#else
	uint64_t num;
	memcpy(&num, buf, sizeof(num));
	return num;
#endif
}